

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall CAtEmLogging::tAtEmLog(CAtEmLogging *this,void *pvParm)

{
  void *pvParm_local;
  CAtEmLogging *this_local;
  
  this->m_bLogTaskRunning = 1;
  while (this->m_bShutdownLogTask == 0) {
    ProcessAllMsgs(this);
    LinuxSleep(1);
  }
  ProcessAllMsgs(this);
  this->m_bLogTaskRunning = 0;
  return;
}

Assistant:

EC_T_VOID CAtEmLogging::tAtEmLog(EC_T_VOID* pvParm)
{
    EC_UNREFPARM(pvParm);

    m_bLogTaskRunning = EC_TRUE;
    while (!m_bShutdownLogTask)
    {
        ProcessAllMsgs();
        OsSleep(1);
    }
    ProcessAllMsgs();
    m_bLogTaskRunning = EC_FALSE;
#if (defined EC_VERSION_RTEMS)
    rtems_task_delete(RTEMS_SELF);
#endif
}